

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O2

DTLSSentRecord * __thiscall
bssl::InplaceVector<bssl::DTLSSentRecord,_32UL>::PushBack
          (InplaceVector<bssl::DTLSSentRecord,_32UL> *this,DTLSSentRecord val)

{
  long lVar1;
  
  if ((ulong)this->size_ < 0x20) {
    lVar1 = (ulong)this->size_ * 0x18;
    *(undefined8 *)(this->storage_ + lVar1 + 0x10) = val._16_8_;
    *(uint64_t *)(this->storage_ + lVar1) = val.number.combined_;
    *(undefined8 *)(this->storage_ + lVar1 + 8) = val._8_8_;
    this->size_ = this->size_ + '\x01';
    return (DTLSSentRecord *)(this->storage_ + lVar1);
  }
  abort();
}

Assistant:

T &PushBack(T val) {
    T *ret = TryPushBack(std::move(val));
    BSSL_CHECK(ret != nullptr);
    return *ret;
  }